

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QPalette QApplication::palette(QWidget *w)

{
  bool bVar1;
  char *pcVar2;
  QPalette *pQVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  QObject *in_RSI;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  QPalette QVar5;
  PaletteHash *widgetPalettes;
  const_iterator cend;
  const_iterator it;
  QByteArray *in_stack_ffffffffffffff78;
  QObject *in_stack_ffffffffffffff80;
  QPalette *this;
  PaletteHash *this_00;
  QByteArray local_30;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &QApplicationPrivate::widgetPalettes;
  this = in_RDI;
  if ((in_RSI != (QObject *)0x0) &&
     (bVar1 = QHash<QByteArray,_QPalette>::isEmpty(&QApplicationPrivate::widgetPalettes), !bVar1)) {
    local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_18.d = (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)&DAT_aaaaaaaaaaaaaaaa;
    (*(code *)**(undefined8 **)in_RSI)();
    pcVar2 = (char *)QMetaObject::className();
    QByteArray::QByteArray(&local_30,pcVar2,-1);
    local_18 = (piter)QHash<QByteArray,_QPalette>::constFind
                                ((QHash<QByteArray,_QPalette> *)in_stack_ffffffffffffff80,
                                 in_stack_ffffffffffffff78);
    QByteArray::~QByteArray((QByteArray *)0x2cb4e2);
    QHash<QByteArray,_QPalette>::constEnd((QHash<QByteArray,_QPalette> *)in_RDI);
    bVar1 = QHash<QByteArray,_QPalette>::const_iterator::operator!=
                      ((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffff80);
    if (bVar1) {
      pQVar3 = QHash<QByteArray,_QPalette>::const_iterator::operator*((const_iterator *)0x2cb52f);
      QPalette::QPalette(in_RDI,(QPalette *)pQVar3);
      uVar4 = extraout_RDX;
      goto LAB_002cb5e2;
    }
    local_18 = (piter)QHash<QByteArray,_QPalette>::constBegin(this_00);
    while (bVar1 = QHash<QByteArray,_QPalette>::const_iterator::operator!=
                             ((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffff80),
          bVar1) {
      in_stack_ffffffffffffff80 = in_RSI;
      QHash<QByteArray,_QPalette>::const_iterator::key((const_iterator *)0x2cb594);
      QByteArray::operator_cast_to_char_((QByteArray *)0x2cb59c);
      bVar1 = QObject::inherits(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      if (bVar1) {
        pQVar3 = QHash<QByteArray,_QPalette>::const_iterator::value((const_iterator *)0x2cb5b9);
        QPalette::QPalette(in_RDI,(QPalette *)pQVar3);
        uVar4 = extraout_RDX_00;
        goto LAB_002cb5e2;
      }
      QHash<QByteArray,_QPalette>::const_iterator::operator++((const_iterator *)this);
    }
  }
  QGuiApplication::palette();
  uVar4 = extraout_RDX_01;
LAB_002cb5e2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar5._8_8_ = uVar4;
  QVar5.d = (QPalettePrivate *)this;
  return QVar5;
}

Assistant:

QPalette QApplication::palette(const QWidget* w)
{
    auto &widgetPalettes = QApplicationPrivate::widgetPalettes;
    if (w && !widgetPalettes.isEmpty()) {
        auto it = widgetPalettes.constFind(w->metaObject()->className());
        const auto cend = widgetPalettes.constEnd();
        if (it != cend)
            return *it;
        for (it = widgetPalettes.constBegin(); it != cend; ++it) {
            if (w->inherits(it.key()))
                return it.value();
        }
    }
    return palette();
}